

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

bool __thiscall Clasp::Asp::PrgBody::resetSupported(PrgBody *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  iVar1 = bound(this);
  this->unsupp_ = iVar1;
  uVar2 = *(uint *)&this->field_0x8 & 0x18000000;
  uVar3 = (ulong)(*(uint *)&this->field_0x8 & 0x1ffffff);
  while ((uVar3 != 0 &&
         ((*(byte *)((long)&this->headData_ + uVar3 * 4 + (ulong)(uVar2 != 0) * 8 + 4) & 2) != 0)))
  {
    iVar4 = 1;
    if (uVar2 == 0x8000000) {
      iVar4 = *(int *)((long)this[1].super_PrgNode + 8 + (uVar3 - 1) * 4);
    }
    iVar1 = iVar1 - iVar4;
    this->unsupp_ = iVar1;
    uVar3 = uVar3 - 1;
  }
  return iVar1 < 1;
}

Assistant:

bool PrgBody::resetSupported() {
	unsupp_ = bound();
	for (uint32 x = size(); x && goal(--x).sign(); ) {
		unsupp_ -= weight(x);
	}
	return isSupported();
}